

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall
Fl_Text_Buffer::call_modify_callbacks
          (Fl_Text_Buffer *this,int pos,int nDeleted,int nInserted,int nRestyled,char *deletedText)

{
  long lVar1;
  
  if (0 < this->mNModifyProcs) {
    lVar1 = 0;
    do {
      (*this->mModifyProcs[lVar1])
                (pos,nInserted,nDeleted,nRestyled,deletedText,this->mCbArgs[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->mNModifyProcs);
  }
  return;
}

Assistant:

void Fl_Text_Buffer::call_modify_callbacks(int pos, int nDeleted,
					   int nInserted, int nRestyled,
					   const char *deletedText) const {
  IS_UTF8_ALIGNED2(this, pos)
  for (int i = 0; i < mNModifyProcs; i++)
    (*mModifyProcs[i]) (pos, nInserted, nDeleted, nRestyled,
			deletedText, mCbArgs[i]);
}